

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmac.cpp
# Opt level: O2

int VHASH_TestSpeedAlt(void *key,int len,int iter)

{
  uint mbytes;
  uint64_t uVar1;
  uint uVar2;
  uint64_t *extraout_RDX;
  uint64_t *extraout_RDX_00;
  int iVar3;
  uint mbytes_00;
  uchar *m;
  uint uVar4;
  bool bVar5;
  int alignedLn;
  uchar lastBlock [144];
  uint64_t *tagl;
  
  mbytes = (len / 0x80) * 0x80;
  uVar2 = len % 0x80;
  tagl = (uint64_t *)(ulong)uVar2;
  iVar3 = 0;
  uVar4 = ~(iter >> 0x1f) & iter;
  while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
    m = (uchar *)key;
    mbytes_00 = len;
    if ((len & 0xfU) != 0) {
      if (0xfe < len + 0x7fU) {
        vhash_update((uchar *)key,mbytes,&vhi.ctx);
      }
      memcpy(lastBlock,(void *)((long)(int)mbytes + (long)key),(long)(int)uVar2);
      memset(lastBlock + (int)uVar2,0,(ulong)(0x10 - (len & 0xfU)));
      tagl = extraout_RDX;
      m = lastBlock;
      mbytes_00 = uVar2;
    }
    uVar1 = vhash(m,mbytes_00,tagl,&vhi.ctx);
    iVar3 = iVar3 + (int)uVar1;
    tagl = extraout_RDX_00;
  }
  return iVar3;
}

Assistant:

int VHASH_TestSpeedAlt( const void * key, int len, int iter )
{
	int dummy = 0;
    uint64_t tagl;
	for ( int i=0; i<iter; i++ )
	{
		if (len & 0xF)
		{
			int blcCnt = len / VMAC_NHBYTES;
			int alignedLn = blcCnt * VMAC_NHBYTES;

			if (alignedLn) 
				vhash_update((unsigned char*)key, alignedLn, &(vhi.ctx));

			ALIGN(16) unsigned char lastBlock[VMAC_NHBYTES + 16];
			int bytesRemaining = len - alignedLn;
			memcpy(lastBlock, (unsigned char*)key + alignedLn, bytesRemaining);
			int bytesRemaining16aligned = ( ( bytesRemaining >> 4) << 4 ) + 16;
			memset(lastBlock + bytesRemaining, 0, bytesRemaining16aligned - bytesRemaining );

			uint64_t tagl;
#if (VMAC_TAG_LEN == 128)
			dummy += vhash((unsigned char *)lastBlock, bytesRemaining, &tagl, &(vhi.ctx));
#elif (VMAC_TAG_LEN == 64)
			dummy += vhash((unsigned char *)lastBlock, bytesRemaining, &tagl, &(vhi.ctx));
#else
#error VMAC_TAG_LEN could be either 64 or 128
#endif
		}
		else // size is a multiple of 16
		{
			uint64_t tagl;
#if (VMAC_TAG_LEN == 128)
			*(uint64_t*)res = vhash((unsigned char *)lastBlock, bytesRemaining + 1, &tagl, &(vhi.ctx));
#elif (VMAC_TAG_LEN == 64)
			dummy += vhash((unsigned char *)key, len, &tagl, &(vhi.ctx));
#else
#error VMAC_TAG_LEN could be either 64 or 128
#endif
		}
	}
	return dummy;
}